

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

int all_tests(void)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  int *piVar19;
  long lVar20;
  long *plVar21;
  undefined8 *puVar22;
  FILE *pFVar23;
  ulong uVar24;
  undefined8 *puVar25;
  clock_t cVar26;
  clock_t cVar27;
  uint *puVar28;
  long lVar29;
  void *pvVar30;
  void *__s2;
  char *pcVar31;
  int i_2;
  uint uVar32;
  uint uVar33;
  short *psVar34;
  short *psVar35;
  uint8_t i_5;
  int iVar36;
  uint *puVar37;
  int j;
  uint uVar38;
  int *piVar39;
  undefined4 *puVar40;
  int i;
  uint uVar41;
  bool bVar42;
  bool bVar43;
  byte bVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint8_t word [3];
  uint8_t expected2 [96];
  uint8_t key [7];
  string_s head;
  uint8_t string [512];
  long local_51d0;
  long local_51c8;
  int *local_51c0;
  undefined8 local_5198;
  undefined8 uStack_5190;
  undefined8 local_5188;
  undefined8 uStack_5180;
  undefined8 local_5178;
  undefined8 uStack_5170;
  undefined8 local_5168;
  undefined8 uStack_5160;
  undefined8 local_5158;
  undefined8 uStack_5150;
  undefined8 local_5148;
  undefined8 uStack_5140;
  undefined8 local_5138;
  undefined8 uStack_5130;
  undefined8 local_5128;
  undefined8 uStack_5120;
  undefined8 local_5118;
  undefined8 uStack_5110;
  undefined8 local_5108;
  undefined8 uStack_5100;
  undefined8 local_50f8;
  undefined8 uStack_50f0;
  undefined8 local_50e8;
  undefined8 uStack_50e0;
  undefined4 local_50d8;
  short local_50c8;
  char cStack_50c6;
  undefined4 uStack_50c5;
  undefined4 uStack_50c1;
  undefined5 uStack_50bd;
  undefined8 local_50b8;
  undefined8 uStack_50b0;
  undefined8 local_50a8;
  undefined8 uStack_50a0;
  undefined8 local_5098;
  undefined8 uStack_5090;
  undefined8 local_5088;
  undefined8 uStack_5080;
  undefined8 local_5078;
  undefined8 uStack_5070;
  undefined1 local_5064 [412];
  undefined2 local_4ec8;
  undefined1 uStack_4ec6;
  undefined1 uStack_4ec5;
  undefined2 uStack_4ec4;
  undefined2 uStack_4ec2;
  undefined4 uStack_4ec0;
  undefined4 uStack_4ebc;
  undefined4 local_4eb8;
  undefined4 uStack_4eb4;
  undefined4 uStack_4eb0;
  undefined4 uStack_4eac;
  undefined4 local_4ea8;
  undefined4 uStack_4ea4;
  undefined4 uStack_4ea0;
  undefined4 uStack_4e9c;
  undefined4 local_4e98;
  undefined4 uStack_4e94;
  undefined4 uStack_4e90;
  undefined4 uStack_4e8c;
  undefined4 local_4e88;
  undefined4 uStack_4e84;
  undefined4 uStack_4e80;
  undefined4 uStack_4e7c;
  undefined4 local_4e78;
  undefined4 uStack_4e74;
  undefined4 uStack_4e70;
  undefined4 uStack_4e6c;
  undefined4 local_4e68;
  undefined4 uStack_4e64;
  byte abStack_4e5a [2];
  undefined4 local_4e58;
  char cStack_4e54;
  char cStack_4e53;
  char cStack_4e52;
  char cStack_4e51;
  char cStack_4e50;
  char cStack_4e4f;
  char cStack_4e4e;
  char cStack_4e4d;
  char cStack_4e4c;
  char cStack_4e4b;
  char cStack_4e4a;
  char cStack_4e49;
  undefined8 local_4e48;
  undefined8 uStack_4e40;
  undefined8 local_4e38;
  undefined8 uStack_4e30;
  undefined8 local_4e28;
  undefined8 uStack_4e20;
  undefined8 local_4e18;
  undefined8 uStack_4e10;
  undefined8 local_4e08;
  undefined8 uStack_4e00;
  undefined8 local_4df8;
  int local_4df0;
  int local_4dec;
  
  bVar44 = 0;
  tests_passed = tests_passed + 1;
  uVar18 = yatrie_new(500,500,200);
  yatrie_add(anon_var_dwarf_14b,0,uVar18);
  memset(&local_4e58,0,0x1f8);
  yatrie_get_word_nodes(&local_4e58,"",0,uVar18);
  bVar42 = (char)local_4e58 != '\0';
  if (bVar42) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2a9,"word_nodes.length == 0");
  }
  uVar32 = (uint)bVar42;
  if (local_4e58._1_1_ != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2aa,"word_nodes.letters[0] == 0");
    uVar32 = uVar32 + 1;
  }
  if (local_4df0 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2ab,"word_nodes.nodes[0] == 0");
    uVar32 = uVar32 + 1;
  }
  memset(&local_4e58,0,0x1f8);
  yatrie_get_word_nodes(&local_4e58,anon_var_dwarf_1be,0,uVar18);
  if ((char)local_4e58 != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2af,"word_nodes.length == 1");
    uVar32 = uVar32 + 1;
  }
  if (local_4e58._1_1_ != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b0,"word_nodes.letters[0] == 1");
    uVar32 = uVar32 + 1;
  }
  if (local_4df0 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b1,"word_nodes.nodes[0] == 1");
    uVar32 = uVar32 + 1;
  }
  yatrie_add(anon_var_dwarf_1f6,0,uVar18);
  memset(&local_4e58,0,0x1f8);
  yatrie_get_word_nodes(&local_4e58,anon_var_dwarf_1be,0,uVar18);
  if ((char)local_4e58 != '\x02') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b6,"word_nodes.length == 2");
    uVar32 = uVar32 + 1;
  }
  if (local_4e58._1_1_ != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b7,"word_nodes.letters[0] == 1");
    uVar32 = uVar32 + 1;
  }
  if (local_4e58._2_1_ != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b8,"word_nodes.letters[1] == 1");
    uVar32 = uVar32 + 1;
  }
  if (local_4df0 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2b9,"word_nodes.nodes[0] == 1");
    uVar32 = uVar32 + 1;
  }
  if (local_4dec != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2ba,"word_nodes.nodes[1] == 2");
    uVar32 = uVar32 + 1;
  }
  yatrie_add(anon_var_dwarf_22e,0,uVar18);
  memset(&local_4e58,0,0x1f8);
  yatrie_get_word_nodes(&local_4e58,anon_var_dwarf_22e,0,uVar18);
  if (cStack_4e54 != '\x01') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2bf,"word_nodes.letters[3] == 1");
    uVar32 = uVar32 + 1;
  }
  if (cStack_4e53 != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2c0,"word_nodes.letters[4] == 0");
    uVar32 = 1;
  }
  iVar36 = 0;
  yatrie_get_id(anon_var_dwarf_22e,0,uVar18);
  yatrie_free(uVar18);
  uVar18 = yatrie_load("./../dic/suffix.trie");
  yatrie_get_id(anon_var_dwarf_266,0,uVar18);
  memset(&local_4e58,0,0x1f8);
  yatrie_get_word_nodes(&local_4e58,anon_var_dwarf_271,0,uVar18);
  piVar39 = &tests_passed;
  piVar19 = &tests_failed;
  if (uVar32 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  uVar18 = yatrie_new(1000,1000,1000);
  yatrie_free(uVar18);
  tests_passed = tests_passed + 1;
  lVar20 = yatrie_load("somethingoriginal.trie");
  if (lVar20 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3bc,"yatrie_load(\"somethingoriginal.trie\") == NULL");
    piVar39 = &tests_failed;
  }
  *piVar39 = *piVar39 + 1;
  cStack_4e50 = 0xff;
  cStack_4e4f = 0xff;
  cStack_4e4e = 0xff;
  cStack_4e4d = 0xff;
  local_4e58._0_1_ = 0xff;
  local_4e58._1_1_ = 0xff;
  local_4e58._2_1_ = 0xff;
  local_4e58._3_1_ = 0xff;
  cStack_4e54 = 0xff;
  cStack_4e53 = 0xff;
  cStack_4e52 = 0xff;
  cStack_4e51 = 0xff;
  uVar32 = 1;
  do {
    uVar38 = uVar32 & 0xff;
    uVar24 = 0;
    uVar33 = uVar32;
    do {
      if ((uint)uVar24 <= uVar32) {
        bVar2 = bit_int32_count(&local_4e58,uVar24 & 0xff,uVar38);
        if (uVar33 != bVar2) {
          bVar2 = bit_int32_count(&local_4e58,uVar24 & 0xff,uVar38);
          printf("%d %d cnt: %d\n",uVar24,(ulong)uVar32,(ulong)bVar2);
        }
        bVar2 = bit_int32_count(&local_4e58,uVar24 & 0xff,uVar38);
        if (uVar33 != bVar2) {
          printf("assert failed: %s:%i expression: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
                 ,0x6a,"bit_int32_count(mask, i, j) == j - i");
          iVar36 = iVar36 + 1;
        }
      }
      uVar41 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar41;
      uVar33 = uVar33 - 1;
    } while (uVar41 != 0x60);
    uVar32 = uVar32 + 1;
  } while (uVar32 != 0x61);
  if (iVar36 == 0) {
    tests_passed = tests_passed + 1;
  }
  else {
    tests_failed = tests_failed + 1;
  }
  tests_passed = tests_passed + 4;
  cStack_4e50 = -1;
  cStack_4e4f = -1;
  cStack_4e4e = -1;
  cStack_4e4d = -1;
  local_4e58._0_1_ = 0xff;
  local_4e58._1_1_ = 0xff;
  local_4e58._2_1_ = 0xff;
  local_4e58._3_1_ = 0xff;
  cStack_4e54 = 0xff;
  cStack_4e53 = 0xff;
  cStack_4e52 = 0xff;
  cStack_4e51 = 0xff;
  uVar32 = 1;
  iVar36 = 0;
  do {
    uVar38 = uVar32 & 0xff;
    uVar24 = 0;
    uVar33 = uVar32;
    do {
      if ((uint)uVar24 <= uVar32) {
        bVar2 = bit_count(&local_4e58,uVar24 & 0xff,uVar38);
        if (uVar33 != bVar2) {
          bVar2 = bit_count(&local_4e58,uVar24 & 0xff,uVar38);
          printf("%d %d cnt: %d\n",uVar24,(ulong)uVar32,(ulong)bVar2);
        }
        bVar2 = bit_count(&local_4e58,uVar24 & 0xff,uVar38);
        if (uVar33 != bVar2) {
          printf("assert failed: %s:%i expression: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
                 ,0x7e,"bit_count(mask, i, j) == j - i");
          iVar36 = iVar36 + 1;
        }
      }
      uVar41 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar41;
      uVar33 = uVar33 - 1;
    } while (uVar41 != 0x60);
    uVar32 = uVar32 + 1;
  } while (uVar32 != 0x61);
  piVar19 = &tests_failed;
  if (iVar36 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  lVar20 = 0;
  iVar36 = 0;
  do {
    cVar3 = char_bit_count((&DAT_001069eb)[lVar20],8);
    if (cVar3 != '\x01') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x40,"count == 1");
      iVar36 = iVar36 + 1;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 8);
  lVar20 = 0;
  do {
    cVar3 = char_bit_count((&DAT_001069f3)[lVar20],8);
    if (cVar3 != '\x02') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x46,"count == 2");
      iVar36 = iVar36 + 1;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 8);
  lVar20 = 0;
  do {
    cVar3 = char_bit_count((&DAT_00105008)[lVar20],8);
    if (cVar3 != '\x04') {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x4c,"count == 4");
      iVar36 = iVar36 + 1;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  bVar2 = 0;
  do {
    bVar4 = char_bit_count(0xaa,bVar2);
    if (bVar4 != bVar2 >> 1) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x52,"count == i / 2");
      iVar36 = iVar36 + 1;
    }
    bVar2 = bVar2 + 1;
  } while (bVar2 != 9);
  cVar3 = char_bit_count(4,2);
  if (cVar3 != '\0') {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x56,"char_bit_count(0b100, 2) == 0");
    iVar36 = iVar36 + 1;
  }
  piVar39 = &tests_failed;
  piVar19 = &tests_failed;
  if (iVar36 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  local_4e58._0_1_ = 0;
  local_4e58._1_1_ = 0;
  local_4e58._2_1_ = 0;
  local_4e58._3_1_ = 0;
  cStack_4e54 = 0;
  cStack_4e53 = 0;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  char_get_bits_raised(&local_4e58,0xff);
  bVar42 = CONCAT17(cStack_4e51,
                    CONCAT16(cStack_4e52,
                             CONCAT15(cStack_4e53,
                                      CONCAT14(cStack_4e54,
                                               CONCAT13(local_4e58._3_1_,
                                                        CONCAT12(local_4e58._2_1_,
                                                                 CONCAT11(local_4e58._1_1_,
                                                                          (char)local_4e58))))))) !=
           0x807060504030201;
  if (bVar42) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x234,"memcmp(expected1, bits, 8) == 0");
  }
  local_4e58._0_1_ = 0;
  local_4e58._1_1_ = 0;
  local_4e58._2_1_ = 0;
  local_4e58._3_1_ = 0;
  cStack_4e54 = 0;
  cStack_4e53 = 0;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  char_get_bits_raised(&local_4e58,1);
  bVar43 = CONCAT17(cStack_4e51,
                    CONCAT16(cStack_4e52,
                             CONCAT15(cStack_4e53,
                                      CONCAT14(cStack_4e54,
                                               CONCAT13(local_4e58._3_1_,
                                                        CONCAT12(local_4e58._2_1_,
                                                                 CONCAT11(local_4e58._1_1_,
                                                                          (char)local_4e58))))))) !=
           1;
  if (bVar43) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x238,"memcmp(expected2, bits, 8) == 0");
  }
  local_4e58._0_1_ = '\0';
  local_4e58._1_1_ = '\0';
  local_4e58._2_1_ = '\0';
  local_4e58._3_1_ = '\0';
  cStack_4e54 = '\0';
  cStack_4e53 = '\0';
  cStack_4e52 = '\0';
  cStack_4e51 = '\0';
  char_get_bits_raised(&local_4e58,0x80);
  if (CONCAT17(cStack_4e51,
               CONCAT16(cStack_4e52,
                        CONCAT15(cStack_4e53,
                                 CONCAT14(cStack_4e54,
                                          CONCAT13(local_4e58._3_1_,
                                                   CONCAT12(local_4e58._2_1_,
                                                            CONCAT11(local_4e58._1_1_,
                                                                     (char)local_4e58))))))) == 8) {
    if (!bVar43 && !bVar42) {
      piVar39 = &tests_passed;
    }
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x23c,"memcmp(expected3, bits, 8) == 0");
  }
  *piVar39 = *piVar39 + 1;
  plVar21 = (long *)char_get_bits_raised_pre(0xff,0);
  cVar3 = *plVar21 != 0x807060504030201;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x211,"memcmp(expected1, bits, 8) == 0");
  }
  plVar21 = (long *)char_get_bits_raised_pre(1,0);
  if (*plVar21 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x216,"memcmp(expected2, bits, 8) == 0");
    cVar3 = cVar3 + '\x01';
  }
  plVar21 = (long *)char_get_bits_raised_pre(0x80,0);
  if (*plVar21 != 8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x21b,"memcmp(expected3, bits, 8) == 0");
    cVar3 = cVar3 + '\x01';
  }
  plVar21 = (long *)char_get_bits_raised_pre(0xaa,10);
  if (*plVar21 != 0x58565452) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x220,"memcmp(expected4, bits, 8) == 0");
    cVar3 = '\x01';
  }
  plVar21 = (long *)char_get_bits_raised_pre(0x81,0);
  if (*plVar21 == 0x801) {
    if (cVar3 != '\0') goto LAB_00101d97;
    piVar19 = &tests_passed;
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x225,"memcmp(expected5, bits, 8) == 0");
LAB_00101d97:
    piVar19 = &tests_failed;
  }
  *piVar19 = *piVar19 + 1;
  puVar22 = (undefined8 *)yatrie_new(5000000,5000000,300);
  uVar24 = 0;
  memset(&local_4e58,0,0x200);
  pFVar23 = fopen((char *)dic_path,"r");
  if (pFVar23 == (FILE *)0x0) {
    local_51d0 = 0;
  }
  else {
    local_51d0 = clock();
    while( true ) {
      while( true ) {
        iVar36 = getc(pFVar23);
        if ((iVar36 != 10) && (iVar36 != 0xd)) break;
        uVar24 = 0;
        yatrie_add(&local_4e58,0,puVar22);
        memset(&local_4e58,0,0x200);
      }
      if (iVar36 == -1) break;
      *(char *)((long)&local_4e58 + (long)(int)uVar24) = (char)iVar36;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    uVar24 = clock();
    fclose(pFVar23);
  }
  yatrie_save("/tmp/test.trie",puVar22);
  puVar25 = (undefined8 *)yatrie_load("/tmp/test.trie");
  cVar26 = clock();
  local_50c8 = 0x6661;
  cStack_50c6 = 0x72;
  uStack_50c5 = 0x616369;
  iVar36 = 1000000;
  do {
    yatrie_get_id(&local_50c8,0,puVar22);
    iVar36 = iVar36 + -1;
  } while (iVar36 != 0);
  cVar27 = clock();
  cVar3 = *(int *)*puVar22 != *(int *)*puVar25;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f5,"trie->nodes->increment == trie2->nodes->increment");
  }
  if (*(int *)puVar22[1] != *(int *)puVar25[1]) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f6,"trie->refs->increment == trie2->refs->increment");
    cVar3 = cVar3 + '\x01';
  }
  if (*(long *)*puVar22 != *(long *)*puVar25) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f7,"memcmp(trie->nodes, trie2->nodes, sizeof(nodes_s)) == 0");
    cVar3 = cVar3 + '\x01';
  }
  if (*(long *)puVar22[1] != *(long *)puVar25[1]) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3f8,"memcmp(trie->refs, trie2->refs, sizeof(refs_s)) == 0");
    cVar3 = '\x01';
  }
  printf("yatrie creation time: %fs\n",(double)((float)(long)(uVar24 - local_51d0) / 1e+06));
  printf("yatrie search time 1 mln. rounds: %fs\n",(double)((float)(cVar27 - cVar26) / 1e+06));
  yatrie_free(puVar22);
  yatrie_free(puVar25);
  piVar19 = &tests_failed;
  if (cVar3 == '\0') {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  puts(
      "TRIE NODE TRAVERSE TEST\nThis test will add a few words to the dictionary.\nThen it will try to traverse all nodes starting\nfrom the given one, gathering all the nodes with\nthe \"leaf\" flag into chains.\n"
      );
  uVar18 = yatrie_new(5000,5000,300);
  psVar35 = &local_50c8;
  puVar22 = &DAT_00106a00;
  psVar34 = psVar35;
  for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
    *(undefined8 *)psVar34 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar44 * -2 + 1;
    psVar34 = psVar34 + (ulong)bVar44 * -8 + 4;
  }
  lVar20 = 0;
  do {
    uVar32 = yatrie_add((long)&local_50c8 + lVar20,0,uVar18);
    printf("added word: %s with node id %d\n",(long)&local_50c8 + lVar20,(ulong)uVar32);
    lVar20 = lVar20 + 0x14;
  } while (lVar20 != 0x78);
  puVar28 = (uint *)calloc(1,0x2714);
  local_4e78 = 0;
  uStack_4e74 = 0;
  uStack_4e70 = 0;
  uStack_4e6c = 0;
  local_4e88 = 0;
  uStack_4e84 = 0;
  uStack_4e80 = 0;
  uStack_4e7c = 0;
  local_4e98 = 0;
  uStack_4e94 = 0;
  uStack_4e90 = 0;
  uStack_4e8c = 0;
  local_4ea8 = 0;
  uStack_4ea4 = 0;
  uStack_4ea0 = 0;
  uStack_4e9c = 0;
  local_4eb8 = 0;
  uStack_4eb4 = 0;
  uStack_4eb0 = 0;
  uStack_4eac = 0;
  local_4ec8 = 0;
  uStack_4ec6 = 0;
  uStack_4ec5 = 0;
  uStack_4ec4 = 0;
  uStack_4ec2 = 0;
  uStack_4ec0 = 0;
  uStack_4ebc = 0;
  local_4e68 = 0;
  uStack_4e64 = 0;
  yatrie_get_id(local_5064,0,uVar18);
  yatrie_node_traverse(puVar28,0,&local_4ec8,uVar18);
  puts("\nTraverse root node completed\nCheck passed and returned words");
  if (*puVar28 == 0) {
    puts("\n");
    yatrie_free(uVar18);
    free(puVar28);
    piVar19 = &tests_passed;
  }
  else {
    puVar37 = puVar28 + 1;
    uVar24 = 0;
    iVar36 = 0;
    do {
      memset(&local_4e58,0,0x100);
      decode_string(&local_4e58,puVar37);
      printf("returned and decoded: %s expected: %s\n",&local_4e58,psVar35);
      uVar17 = *(undefined4 *)(psVar35 + 8);
      auVar46[0] = -((char)*psVar35 == (char)local_4e58);
      auVar46[1] = -(*(char *)((long)psVar35 + 1) == local_4e58._1_1_);
      auVar46[2] = -((char)psVar35[1] == local_4e58._2_1_);
      auVar46[3] = -(*(char *)((long)psVar35 + 3) == local_4e58._3_1_);
      auVar46[4] = -((char)psVar35[2] == cStack_4e54);
      auVar46[5] = -(*(char *)((long)psVar35 + 5) == cStack_4e53);
      auVar46[6] = -((char)psVar35[3] == cStack_4e52);
      auVar46[7] = -(*(char *)((long)psVar35 + 7) == cStack_4e51);
      auVar46[8] = -((char)psVar35[4] == cStack_4e50);
      auVar46[9] = -(*(char *)((long)psVar35 + 9) == cStack_4e4f);
      auVar46[10] = -((char)psVar35[5] == cStack_4e4e);
      auVar46[0xb] = -(*(char *)((long)psVar35 + 0xb) == cStack_4e4d);
      auVar46[0xc] = -((char)psVar35[6] == cStack_4e4c);
      auVar46[0xd] = -(*(char *)((long)psVar35 + 0xd) == cStack_4e4b);
      auVar46[0xe] = -((char)psVar35[7] == cStack_4e4a);
      auVar46[0xf] = -(*(char *)((long)psVar35 + 0xf) == cStack_4e49);
      auVar47[0] = -((char)uVar17 == (char)local_4e48);
      auVar47[1] = -((char)((uint)uVar17 >> 8) == (char)((ulong)local_4e48 >> 8));
      auVar47[2] = -((char)((uint)uVar17 >> 0x10) == (char)((ulong)local_4e48 >> 0x10));
      auVar47[3] = -((char)((uint)uVar17 >> 0x18) == (char)((ulong)local_4e48 >> 0x18));
      auVar47[4] = 0xff;
      auVar47[5] = 0xff;
      auVar47[6] = 0xff;
      auVar47[7] = 0xff;
      auVar47[8] = 0xff;
      auVar47[9] = 0xff;
      auVar47[10] = 0xff;
      auVar47[0xb] = 0xff;
      auVar47[0xc] = 0xff;
      auVar47[0xd] = 0xff;
      auVar47[0xe] = 0xff;
      auVar47[0xf] = 0xff;
      auVar46 = auVar46 & auVar47;
      if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) != 0xffff) {
        printf("assert failed: %s:%i expression: %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
               ,0x32d,"memcmp(dst, words[i], sizeof(words[i])) == 0");
        iVar36 = iVar36 + 1;
      }
      uVar24 = uVar24 + 1;
      psVar35 = psVar35 + 10;
      puVar37 = puVar37 + 0x19;
    } while (uVar24 < *puVar28);
    puts("\n");
    yatrie_free(uVar18);
    free(puVar28);
    piVar19 = &tests_failed;
    if (iVar36 == 0) {
      piVar19 = &tests_passed;
    }
  }
  piVar39 = &tests_failed;
  *piVar19 = *piVar19 + 1;
  local_50c8 = 0x302;
  cStack_50c6 = 4;
  uStack_50c5 = 0x8070605;
  uStack_50c1 = 0xb0a09;
  memset(&local_4e58,0,0x100);
  decode_string(&local_4e58,&local_50c8);
  if (CONCAT17(cStack_4e4e,
               CONCAT16(cStack_4e4f,
                        CONCAT15(cStack_4e50,
                                 CONCAT14(cStack_4e51,
                                          CONCAT13(cStack_4e52,
                                                   CONCAT12(cStack_4e53,
                                                            CONCAT11(cStack_4e54,local_4e58._3_1_)))
                                         )))) == 0x39383736353433 &&
      CONCAT17(cStack_4e51,
               CONCAT16(cStack_4e52,
                        CONCAT15(cStack_4e53,
                                 CONCAT14(cStack_4e54,
                                          CONCAT13(local_4e58._3_1_,
                                                   CONCAT12(local_4e58._2_1_,
                                                            CONCAT11(local_4e58._1_1_,
                                                                     (char)local_4e58))))))) ==
      0x3736353433323130) {
    piVar39 = &tests_passed;
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3b6,"memcmp(dst, \"0123456789\", sizeof(\"0123456789\")) == 0");
  }
  *piVar39 = *piVar39 + 1;
  plVar21 = (long *)yatrie_new(100,100,100);
  lVar20 = *plVar21;
  *(undefined4 *)(lVar20 + 8) = 1;
  iVar5 = node_insert_ref(7,0,lVar20 + 8,plVar21);
  iVar36 = *(int *)plVar21[1];
  if (iVar36 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd0,"trie->refs->increment == 1");
  }
  uVar32 = (uint)(iVar36 != 1);
  if (*(int *)(*plVar21 + 8) != 0x41) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd2,"trie->nodes->data[0].mask[0] == 0b1000001");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 8) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd4,"trie->refs->data[0] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  if (*(int *)(lVar20 + 8 + (ulong)*(uint *)(lVar29 + 0x14) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xd6,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar36 = node_insert_ref(6,0,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xdb,"trie->refs->increment == 3");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x61) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xdd,"trie->nodes->data[0].mask[0] == 0b1100001");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0xc) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xdf,"trie->refs->data[1] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x10) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe0,"trie->refs->data[2] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe2,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe3,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar6 = node_insert_ref(5,0,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xe8,"trie->refs->increment == 6");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x71) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xea,"trie->nodes->data[0].mask[0] == 0b1110001");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x14) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xec,"trie->refs->data[3] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x18) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xed,"trie->refs->data[4] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x1c) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xee,"trie->refs->data[5] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf0,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf1,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf2,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar7 = node_insert_ref(2,0,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xf8,"trie->refs->increment == 10");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x73) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfa,"trie->nodes->data[0].mask[0] == 0b1110011");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x20) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfc,"trie->refs->data[6] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x24) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfd,"trie->refs->data[7] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x28) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xfe,"trie->refs->data[8] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x2c) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0xff,"trie->refs->data[9] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x101,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x102,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x103,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x104,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar8 = node_insert_ref(3,1,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 0xf) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x109,"trie->refs->increment == 15");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)(*plVar21 + 8) != 0x77) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10b,"trie->nodes->data[0].mask[0] == 0b1110111");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x30) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10d,"trie->refs->data[10] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x34) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10e,"trie->refs->data[11] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x38) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x10f,"trie->refs->data[12] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x3c) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x110,"trie->refs->data[13] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x40) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x111,"trie->refs->data[14] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x113,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x114,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x115,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x116,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x117,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar9 = node_insert_ref(0x5e,5,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 0x15) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x11c,"trie->refs->increment == 21");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 8) != 0x77) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x11e,"trie->nodes->data[0].mask[0] == 0b1110111");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(lVar20 + 0x10) != 0x20000000) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x11f,"trie->nodes->data[0].mask[2] == 0b100000000000000000000000000000");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x44) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x121,"trie->refs->data[15] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x48) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x122,"trie->refs->data[16] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x4c) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x123,"trie->refs->data[17] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x50) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x124,"trie->refs->data[18] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x54) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x125,"trie->refs->data[19] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x58) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x126,"trie->refs->data[20] == node_id_bit94");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  lVar29 = *plVar21;
  uVar33 = *(uint *)(lVar29 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x128,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x129,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x12a,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,299,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,300,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(lVar29 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 5) * 4) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x12d,"trie->refs->data[trie->nodes->data[0].ref_id + 5] == node_id_bit94");
    uVar32 = uVar32 + 1;
    lVar29 = *plVar21;
  }
  iVar10 = node_insert_ref(0x21,5,lVar29 + 8,plVar21);
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x132,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 8) != 0x77) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x134,"trie->nodes->data[0].mask[0] == 0b1110111");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(lVar20 + 0x10) != 0x20000000) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x135,"trie->nodes->data[0].mask[2] == 0b100000000000000000000000000000");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(lVar20 + 0xc) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x136,"trie->nodes->data[0].mask[1] == 0b1");
    uVar32 = uVar32 + 1;
  }
  lVar20 = plVar21[1];
  if (*(int *)(lVar20 + 0x5c) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x138,"trie->refs->data[21] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x60) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x139,"trie->refs->data[22] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 100) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13a,"trie->refs->data[23] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x68) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13b,"trie->refs->data[24] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x6c) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13c,"trie->refs->data[25] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x70) != iVar10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13d,"trie->refs->data[26] == node_id_bit33");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  if (*(int *)(lVar20 + 0x74) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x13e,"trie->refs->data[27] == node_id_bit94");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
  }
  uVar33 = *(uint *)(*plVar21 + 0x14);
  if (*(int *)(lVar20 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x140,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x141,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x142,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 3) * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x143,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x144,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 5) * 4) != iVar10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x145,"trie->refs->data[trie->nodes->data[0].ref_id + 5] == node_id_bit33");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar20 + 8 + (ulong)(uVar33 + 6) * 4) != iVar9) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x146,"trie->refs->data[trie->nodes->data[0].ref_id + 6] == node_id_bit94");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x10) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x14c,"trie->refs_free->data[1]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar11 = node_insert_ref(2,0,*plVar21 + 0x18,plVar21);
  if (**(int **)(plVar21[2] + 0x10) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x14e,"trie->refs_free->data[1]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x150,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x152,"trie->nodes->data[1].mask[0] == 0b10");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  if (*(int *)(plVar21[1] + 8 + (ulong)*(uint *)(lVar20 + 0x24) * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x154,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x18) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x158,"trie->refs_free->data[2]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar12 = node_insert_ref(3,1,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x10) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15a,"trie->refs_free->data[1]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x18) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15b,"trie->refs_free->data[2]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15d,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x15f,"trie->nodes->data[1].mask[0] == 0b110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x161,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x162,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x20) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x166,"trie->refs_free->data[3]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar13 = node_insert_ref(4,2,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x18) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x168,"trie->refs_free->data[2]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x20) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x169,"trie->refs_free->data[3]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x16b,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0xe) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x16d,"trie->nodes->data[1].mask[0] == 0b1110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x16f,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x170,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x171,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x28) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x175,"trie->refs_free->data[4]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar14 = node_insert_ref(5,3,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x20) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x177,"trie->refs_free->data[3]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x28) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x178,"trie->refs_free->data[4]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17a,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0x1e) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17c,"trie->nodes->data[1].mask[0] == 0b11110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17e,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x17f,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x180,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar14) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x181,"trie->refs->data[trie->nodes->data[1].ref_id + 3] == node11_bit5");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x30) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x185,"trie->refs_free->data[5]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar15 = node_insert_ref(6,4,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x28) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x187,"trie->refs_free->data[4]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x30) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x188,"trie->refs_free->data[5]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x18a,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0x3e) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x18c,"trie->nodes->data[1].mask[0] == 0b111110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x18e,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,399,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,400,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar14) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x191,"trie->refs->data[trie->nodes->data[1].ref_id + 3] == node11_bit5");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 4) * 4) != iVar15) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x192,"trie->refs->data[trie->nodes->data[1].ref_id + 4] == node12_bit6");
    uVar32 = uVar32 + 1;
  }
  if (**(int **)(plVar21[2] + 0x38) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x196,"trie->refs_free->data[6]->elements == 1");
    uVar32 = uVar32 + 1;
  }
  iVar16 = node_insert_ref(7,5,*plVar21 + 0x18,plVar21);
  lVar20 = plVar21[2];
  if (**(int **)(lVar20 + 0x30) != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x198,"trie->refs_free->data[5]->elements == 1");
    uVar32 = uVar32 + 1;
    lVar20 = plVar21[2];
  }
  if (**(int **)(lVar20 + 0x38) != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x199,"trie->refs_free->data[6]->elements == 0");
    uVar32 = uVar32 + 1;
  }
  if (*(int *)plVar21[1] != 0x1c) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x19b,"trie->refs->increment == 28");
    uVar32 = uVar32 + 1;
  }
  lVar20 = *plVar21;
  if (*(int *)(lVar20 + 0x18) != 0x7e) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x19d,"trie->nodes->data[1].mask[0] == 0b1111110");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
  }
  lVar29 = plVar21[1];
  uVar33 = *(uint *)(lVar20 + 0x24);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar11) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x19f,"trie->refs->data[trie->nodes->data[1].ref_id] == node8_bit2");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar12) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a0,"trie->refs->data[trie->nodes->data[1].ref_id + 1] == node9_bit3");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar13) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a1,"trie->refs->data[trie->nodes->data[1].ref_id + 2] == node10_bit4");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar14) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a2,"trie->refs->data[trie->nodes->data[1].ref_id + 3] == node11_bit5");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 4) * 4) != iVar15) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a3,"trie->refs->data[trie->nodes->data[1].ref_id + 4] == node12_bit6");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(lVar20 + 0x24);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 5) * 4) != iVar16) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a4,"trie->refs->data[trie->nodes->data[1].ref_id + 5] == node13_bit7");
    uVar32 = uVar32 + 1;
    lVar20 = *plVar21;
    lVar29 = plVar21[1];
  }
  uVar33 = *(uint *)(lVar20 + 0x14);
  if (*(int *)(lVar29 + 8 + (ulong)uVar33 * 4) != iVar7) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a8,"trie->refs->data[trie->nodes->data[0].ref_id] == node_id_bit2");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 1) * 4) != iVar8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1a9,"trie->refs->data[trie->nodes->data[0].ref_id + 1] == node_id_bit3");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 2) * 4) != iVar6) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1aa,"trie->refs->data[trie->nodes->data[0].ref_id + 2] == node_id_bit6");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 3) * 4) != iVar36) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ab,"trie->refs->data[trie->nodes->data[0].ref_id + 3] == node_id_bit7");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 4) * 4) != iVar5) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ac,"trie->refs->data[trie->nodes->data[0].ref_id + 4] == node_id_bit8");
    uVar32 = uVar32 + 1;
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 5) * 4) != iVar10) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ad,"trie->refs->data[trie->nodes->data[0].ref_id + 5] == node_id_bit33");
    lVar29 = plVar21[1];
    uVar33 = *(uint *)(*plVar21 + 0x14);
    uVar32 = 1;
  }
  if (*(int *)(lVar29 + 8 + (ulong)(uVar33 + 6) * 4) == iVar9) {
    yatrie_free(plVar21);
    if (uVar32 != 0) goto LAB_00103e17;
    piVar19 = &tests_passed;
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1ae,"trie->refs->data[trie->nodes->data[0].ref_id + 6] == node_id_bit94");
    yatrie_free(plVar21);
LAB_00103e17:
    piVar19 = &tests_failed;
  }
  *piVar19 = *piVar19 + 1;
  uVar18 = yatrie_new(500,500,100);
  memcpy(&local_4e58,&DAT_00106a80,0x480);
  lVar20 = 0;
  do {
    yatrie_add((long)&local_4e58 + lVar20,0,uVar18);
    lVar20 = lVar20 + 0x40;
  } while (lVar20 != 0x480);
  lVar20 = 0;
  iVar36 = 0;
  do {
    iVar5 = yatrie_get_id((long)&local_4e58 + lVar20,0,uVar18);
    if (iVar5 == 0) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x35b,"nodes_ids[i] = yatrie_get_id(words[i], 0, trie)");
      iVar36 = iVar36 + 1;
    }
    lVar20 = lVar20 + 0x40;
  } while (lVar20 != 0x480);
  yatrie_free(uVar18);
  piVar19 = &tests_failed;
  piVar39 = &tests_passed;
  if (iVar36 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  uVar18 = yatrie_new(500,500,200);
  iVar36 = 0;
  yatrie_add(anon_var_dwarf_8cd,0,uVar18);
  yatrie_add(anon_var_dwarf_8d9,0,uVar18);
  yatrie_add(anon_var_dwarf_8e5,0,uVar18);
  yatrie_add(anon_var_dwarf_8f1,0,uVar18);
  yatrie_add(anon_var_dwarf_8fd,0,uVar18);
  puVar28 = (uint *)calloc(1,0x2714);
  local_4e08 = 0;
  uStack_4e00 = 0;
  local_4e18 = 0;
  uStack_4e10 = 0;
  local_4e28 = 0;
  uStack_4e20 = 0;
  local_4e38 = 0;
  uStack_4e30 = 0;
  local_4e48 = 0;
  uStack_4e40 = 0;
  local_4e58._0_1_ = 0;
  local_4e58._1_1_ = 0;
  local_4e58._2_1_ = 0;
  local_4e58._3_1_ = 0;
  cStack_4e54 = 0;
  cStack_4e53 = 0;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  cStack_4e50 = 0;
  cStack_4e4f = 0;
  cStack_4e4e = 0;
  cStack_4e4d = 0;
  cStack_4e4c = 0;
  cStack_4e4b = 0;
  cStack_4e4a = 0;
  cStack_4e49 = 0;
  local_4df8 = 0;
  yatrie_node_traverse(puVar28,0,&local_4e58,uVar18);
  if ((ulong)*puVar28 == 0) {
LAB_00103ff4:
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2f5,"length == expected_letters");
    yatrie_free(uVar18);
    free(puVar28);
    piVar39 = &tests_failed;
  }
  else {
    pcVar31 = (char *)((long)puVar28 + 5);
    uVar24 = 0;
    do {
      cVar3 = (char)puVar28[uVar24 * 0x19 + 1];
      pcVar1 = pcVar31;
      while (cVar3 != '\0') {
        iVar36 = iVar36 + 1;
        cVar3 = *pcVar1;
        pcVar1 = pcVar1 + 1;
      }
      uVar24 = uVar24 + 1;
      pcVar31 = pcVar31 + 100;
    } while (uVar24 != *puVar28);
    if (iVar36 != 0x1d) goto LAB_00103ff4;
    yatrie_free(uVar18);
    free(puVar28);
  }
  *piVar39 = *piVar39 + 1;
  uVar18 = yatrie_new(9000,9000,9000);
  uVar24 = 0;
  memset(&local_4e58,0,20000);
  memset(&local_50c8,0,0x200);
  pFVar23 = fopen("./dic/english.txt","r");
  psVar35 = &local_50c8;
  if (pFVar23 == (FILE *)0x0) {
    yatrie_free(uVar18);
    piVar19 = &tests_passed;
  }
  else {
    while( true ) {
      while ((iVar36 = getc(pFVar23), iVar36 == 0xd || (iVar36 == 10))) {
        uVar17 = yatrie_add(&local_50c8,0,uVar18);
        (&local_4e58)[uVar24] = uVar17;
        memset(&local_50c8,0,0x200);
        uVar24 = (ulong)((int)uVar24 + 1);
        psVar35 = &local_50c8;
      }
      if (iVar36 == -1) break;
      *(char *)psVar35 = (char)iVar36;
      psVar35 = (short *)((long)psVar35 + 1);
    }
    rewind(pFVar23);
    iVar36 = 0;
    uVar24 = 0;
    psVar35 = &local_50c8;
    while (iVar5 = getc(pFVar23), iVar5 != -1) {
      if ((iVar5 == 0xd) || (iVar5 == 10)) {
        iVar5 = yatrie_get_id(&local_50c8,0,uVar18);
        if (iVar5 != (&local_4e58)[uVar24]) {
          printf("assert failed: %s:%i expression: %s\n",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
                 ,0x1f1,"yatrie_get_id(string, 0, trie) == nodes_ids[i]");
          iVar36 = iVar36 + 1;
        }
        memset(&local_50c8,0,0x200);
        uVar24 = (ulong)((int)uVar24 + 1);
        psVar35 = &local_50c8;
      }
      else {
        *(char *)psVar35 = (char)iVar5;
        psVar35 = (short *)((long)psVar35 + 1);
      }
    }
    fclose(pFVar23);
    yatrie_free(uVar18);
    piVar19 = &tests_passed;
    if (iVar36 != 0) {
      piVar19 = &tests_failed;
    }
  }
  piVar39 = &tests_failed;
  *piVar19 = *piVar19 + 1;
  plVar21 = (long *)yatrie_new(500,500,100);
  lVar20 = *plVar21;
  *(undefined4 *)(lVar20 + 8) = 0x17;
  *(undefined4 *)(lVar20 + 0x14) = 0;
  uStack_50c5 = 0;
  uStack_50c1 = 0;
  uStack_50bd = 0;
  local_5078 = 0;
  uStack_5070 = 0;
  local_5088 = 0;
  uStack_5080 = 0;
  local_5098 = 0;
  uStack_5090 = 0;
  local_50a8 = 0;
  uStack_50a0 = 0;
  local_50b8 = 0;
  uStack_50b0 = 0;
  local_50c8 = 0x201;
  cStack_50c6 = '\x03';
  memset(&local_4e58,0,0x180);
  local_4e58._0_1_ = 0x57;
  local_4e58._1_1_ = 4;
  local_4e58._2_1_ = 0;
  local_4e58._3_1_ = 0;
  cStack_4e54 = 0xae;
  cStack_4e53 = 8;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  cStack_4e50 = 5;
  cStack_4e4f = 0xd;
  cStack_4e4e = 0;
  cStack_4e4d = 0;
  lVar20 = plVar21[1];
  *(undefined8 *)(lVar20 + 8) = 0x8ae00000457;
  *(undefined4 *)(lVar20 + 0x10) = 0xd05;
  pcVar31 = (char *)calloc(1,0x1e4);
  yatrie_node_get_children(pcVar31,0,plVar21);
  cVar3 = *pcVar31 != '\x03';
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x295,"children->length == 3");
  }
  if (pcVar31[3] != cStack_50c6 || *(short *)(pcVar31 + 1) != local_50c8) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x296,"memcmp(children->letters, expected11, 3) == 0");
    cVar3 = cVar3 + '\x01';
  }
  if (*(int *)(pcVar31 + 0x6c) !=
      CONCAT13(cStack_4e4d,CONCAT12(cStack_4e4e,CONCAT11(cStack_4e4f,cStack_4e50))) ||
      *(long *)(pcVar31 + 100) !=
      CONCAT17(cStack_4e51,
               CONCAT16(cStack_4e52,
                        CONCAT15(cStack_4e53,
                                 CONCAT14(cStack_4e54,
                                          CONCAT13(local_4e58._3_1_,
                                                   CONCAT12(local_4e58._2_1_,
                                                            CONCAT11(local_4e58._1_1_,
                                                                     (char)local_4e58)))))))) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x297,"memcmp(children->nodes, expected12, 3 << REF_SIZE_POWER) == 0");
    cVar3 = '\x01';
  }
  yatrie_free(plVar21);
  free(pcVar31);
  piVar19 = &tests_failed;
  if (cVar3 == '\0') {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  uStack_4ec5 = 0;
  uStack_4ec4 = 0;
  uStack_4ec2 = 0;
  uStack_4ec0 = 0;
  uStack_4ebc = 0;
  local_4e78 = 0;
  uStack_4e74 = 0;
  uStack_4e70 = 0;
  uStack_4e6c = 0;
  local_4e88 = 0;
  uStack_4e84 = 0;
  uStack_4e80 = 0;
  uStack_4e7c = 0;
  local_4e98 = 0;
  uStack_4e94 = 0;
  uStack_4e90 = 0;
  uStack_4e8c = 0;
  local_4ea8 = 0;
  uStack_4ea4 = 0;
  uStack_4ea0 = 0;
  uStack_4e9c = 0;
  local_4eb8 = 0;
  uStack_4eb4 = 0;
  uStack_4eb0 = 0;
  uStack_4eac = 0;
  local_4ec8 = 0x201;
  uStack_4ec6 = 3;
  uStack_5130 = 0;
  local_50e8 = 0;
  uStack_50e0 = 0;
  local_50f8 = 0;
  uStack_50f0 = 0;
  local_5108 = 0;
  uStack_5100 = 0;
  local_5118 = 0;
  uStack_5110 = 0;
  local_5128 = 0;
  uStack_5120 = 0;
  local_5138 = 0x1e140a;
  uStack_5190 = 0;
  local_5148 = 0;
  uStack_5140 = 0;
  local_5158 = 0;
  uStack_5150 = 0;
  local_5168 = 0;
  uStack_5160 = 0;
  local_5178 = 0;
  uStack_5170 = 0;
  local_5188 = 0;
  uStack_5180 = 0;
  local_5198 = 0x21160b;
  local_4e08 = 0;
  uStack_4e00 = 0;
  local_4e18 = 0;
  uStack_4e10 = 0;
  local_4e28 = 0;
  uStack_4e20 = 0;
  local_4e38 = 0;
  uStack_4e30 = 0;
  local_4e48 = 0;
  uStack_4e40 = 0;
  local_4e58._1_1_ = 0;
  local_4e58._2_1_ = 0;
  local_4e58._3_1_ = 0;
  cStack_4e54 = 0;
  cStack_4e53 = 0;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  cStack_4e50 = 0;
  cStack_4e4f = 0;
  cStack_4e4e = 0;
  cStack_4e4d = 0;
  cStack_4e4c = 0;
  cStack_4e4b = 0;
  cStack_4e4a = 0;
  cStack_4e49 = 0;
  local_5078 = 0;
  uStack_5070 = 0;
  local_5088 = 0;
  uStack_5080 = 0;
  local_5098 = 0;
  uStack_5090 = 0;
  local_50a8 = 0;
  uStack_50a0 = 0;
  local_50b8 = 0;
  uStack_50b0 = 0;
  local_50c8 = 0;
  cStack_50c6 = 0;
  uStack_50c5 = 0;
  uStack_50c1 = 0;
  uStack_50bd = 0;
  local_4e58._0_1_ = 7;
  char_mask_get_bits_raised_pre(&local_50c8);
  iVar36 = bcmp(&local_4ec8,&local_50c8,0x60);
  cVar3 = iVar36 != 0;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x255,"memcmp(expected1, bits, MASK_BITS) == 0");
  }
  local_4e58._0_1_ = 0;
  cStack_4e54 = 0;
  cStack_4e53 = 0;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  cStack_4e50 = 0;
  cStack_4e4f = 0;
  cStack_4e4e = 0;
  cStack_4e4d = 0;
  cStack_4e4c = 0;
  cStack_4e4b = 0;
  cStack_4e4a = 0;
  cStack_4e49 = 0;
  local_4e08 = 0;
  uStack_4e00 = 0;
  local_4e18 = 0;
  uStack_4e10 = 0;
  local_4e28 = 0;
  uStack_4e20 = 0;
  local_4e38 = 0;
  uStack_4e30 = 0;
  local_4e48 = 0;
  uStack_4e40 = 0;
  local_50c8 = 0;
  cStack_50c6 = 0;
  uStack_50c5 = 0;
  uStack_50c1 = 0;
  uStack_50bd = 0;
  local_50b8 = 0;
  uStack_50b0 = 0;
  local_50a8 = 0;
  uStack_50a0 = 0;
  local_5098 = 0;
  uStack_5090 = 0;
  local_5088 = 0;
  uStack_5080 = 0;
  local_5078 = 0;
  uStack_5070 = 0;
  local_4e58._1_1_ = 2;
  local_4e58._2_1_ = 8;
  local_4e58._3_1_ = 0x20;
  char_mask_get_bits_raised_pre(&local_50c8);
  iVar36 = bcmp(&local_5138,&local_50c8,0x60);
  if (iVar36 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x25e,"memcmp(expected2, bits, MASK_BITS) == 0");
    cVar3 = cVar3 + '\x01';
  }
  local_4e58._0_1_ = 0;
  local_4e58._3_1_ = 0;
  cStack_4e53 = 0;
  cStack_4e52 = 0;
  cStack_4e51 = 0;
  cStack_4e50 = 0;
  cStack_4e4f = 0;
  cStack_4e4e = 0;
  cStack_4e4d = 0;
  cStack_4e4c = 0;
  cStack_4e4b = 0;
  cStack_4e4a = 0;
  cStack_4e49 = 0;
  local_4e08 = 0;
  uStack_4e00 = 0;
  local_4e18 = 0;
  uStack_4e10 = 0;
  local_4e28 = 0;
  uStack_4e20 = 0;
  local_4e38 = 0;
  uStack_4e30 = 0;
  local_4e48 = 0;
  uStack_4e40 = 0;
  local_50c8 = 0;
  cStack_50c6 = 0;
  uStack_50c5 = 0;
  uStack_50c1 = 0;
  uStack_50bd = 0;
  local_50b8 = 0;
  uStack_50b0 = 0;
  local_50a8 = 0;
  uStack_50a0 = 0;
  local_5098 = 0;
  uStack_5090 = 0;
  local_5088 = 0;
  uStack_5080 = 0;
  local_5078 = 0;
  uStack_5070 = 0;
  local_4e58._1_1_ = 4;
  local_4e58._2_1_ = 0x20;
  cStack_4e54 = 1;
  char_mask_get_bits_raised_pre(&local_50c8);
  iVar36 = bcmp(&local_5198,&local_50c8,0x60);
  if (iVar36 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x267,"memcmp(expected3, bits, MASK_BITS) == 0");
    cVar3 = '\x01';
  }
  cStack_4e4c = 0;
  cStack_4e4b = 0;
  cStack_4e4a = 0;
  cStack_4e49 = 0;
  local_4e08 = 0;
  uStack_4e00 = 0;
  local_4e18 = 0;
  uStack_4e10 = 0;
  local_4e28 = 0;
  uStack_4e20 = 0;
  local_4e38 = 0;
  uStack_4e30 = 0;
  local_4e48 = 0;
  uStack_4e40 = 0;
  local_50c8 = 0;
  cStack_50c6 = 0;
  uStack_50c5 = 0;
  uStack_50c1 = 0;
  uStack_50bd = 0;
  local_50b8 = 0;
  uStack_50b0 = 0;
  local_50a8 = 0;
  uStack_50a0 = 0;
  local_5098 = 0;
  uStack_5090 = 0;
  local_5088 = 0;
  uStack_5080 = 0;
  local_5078 = 0;
  uStack_5070 = 0;
  local_4e58._0_1_ = 0x81;
  local_4e58._1_1_ = 0x81;
  local_4e58._2_1_ = 0x81;
  local_4e58._3_1_ = 0x81;
  cStack_4e54 = 0x81;
  cStack_4e53 = 0x81;
  cStack_4e52 = 0x81;
  cStack_4e51 = 0x81;
  cStack_4e50 = 0x81;
  cStack_4e4f = 0x81;
  cStack_4e4e = 0x81;
  cStack_4e4d = 0x81;
  char_mask_get_bits_raised_pre(&local_50c8);
  iVar36 = bcmp(&DAT_00106f00,&local_50c8,0x60);
  if (iVar36 == 0) {
    if (cVar3 == '\0') {
      piVar39 = &tests_passed;
    }
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x279,"memcmp(expected4, bits, MASK_BITS) == 0");
  }
  *piVar39 = *piVar39 + 1;
  pvVar30 = (void *)yatrie_new(500,500,100);
  iVar36 = yatrie_char_add(0,0x5f,pvVar30);
  cVar3 = iVar36 != 1;
  if ((bool)cVar3) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1bf,"node_id_inserted == 1");
  }
  iVar36 = yatrie_char_add(0,0x5f,pvVar30);
  if (iVar36 != 1) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1c3,"node_id_inserted == 1");
    cVar3 = cVar3 + '\x01';
  }
  iVar36 = yatrie_char_add(1,2,pvVar30);
  if (iVar36 != 2) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1c7,"node_id_inserted == 2");
    cVar3 = '\x01';
  }
  iVar36 = yatrie_char_add(2,0x32,pvVar30);
  if (iVar36 == 3) {
    free(pvVar30);
    if (cVar3 == '\0') {
      piVar19 = &tests_passed;
      goto LAB_00104751;
    }
  }
  else {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x1cb,"node_id_inserted == 3");
    free(pvVar30);
  }
  piVar19 = &tests_failed;
LAB_00104751:
  *piVar19 = *piVar19 + 1;
  puVar22 = &DAT_00106f60;
  psVar35 = &local_50c8;
  for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
    *(undefined8 *)psVar35 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar44 * -2 + 1;
    psVar35 = psVar35 + ((ulong)bVar44 * -2 + 1) * 4;
  }
  uVar24 = (ulong)uStack_5080 >> 0x20;
  uStack_5080 = CONCAT44((uint)uVar24 & 0xffffff00,0x8fd18ed1);
  memset(&local_4e58,0,0x100);
  encode_string(&local_4e58,&local_50c8);
  uVar24 = 2;
  iVar36 = 0;
  do {
    if (uVar24 != abStack_4e5a[uVar24]) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0xbe,"dst[i] == i + 2");
      iVar36 = iVar36 + 1;
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x2d);
  piVar19 = &tests_failed;
  local_51c0 = &tests_passed;
  if (iVar36 == 0) {
    piVar19 = &tests_passed;
  }
  *piVar19 = *piVar19 + 1;
  puVar22 = (undefined8 *)yatrie_new(5000000,5000000,200);
  puts(
      "COMPLEX TEST\nThis test will create trie from a dictionary file, \nthen compare each word leaf node id with returned \nnode id by the yatrie_get_id() function \n"
      );
  cVar26 = 0;
  printf("Trie settings:\nnode size:       %u bytes\n");
  printf("trie size:       %u kb\n");
  printf("trie size nodes: %u kb\n");
  printf("trie size refs:  %u kb\n\n");
  memset(&local_4e58,0,0x200);
  pvVar30 = calloc(6000000,4);
  __s2 = calloc(6000000,4);
  pFVar23 = fopen((char *)dic_path,"r");
  local_51c8 = 0;
  if (pFVar23 == (FILE *)0x0) {
LAB_001049e5:
    iVar36 = bcmp(pvVar30,__s2,24000000);
    if (iVar36 != 0) {
      printf("assert failed: %s:%i expression: %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
             ,0x3a4,"memcmp(added_nodes, getted_nodes, MAX_NODES * 4) == 0");
      local_51c0 = &tests_failed;
    }
    printf("trie creation time: %fs\n",(double)((float)(cVar26 - local_51c8) / 1e+06));
    iVar36 = 0;
    printf("nodes created: %d\nreferences created: %d\n",(ulong)*(uint *)*puVar22,
           (ulong)*(uint *)puVar22[1]);
    free(pvVar30);
    free(__s2);
    yatrie_free(puVar22);
    *local_51c0 = *local_51c0 + 1;
    puts("\n\nANOTHER NODE TRAVERSE");
    uVar18 = yatrie_new(5000000,5000000,200);
    memset(&local_4e58,0,0x200);
    pFVar23 = fopen((char *)dic_path,"r");
    if (pFVar23 == (FILE *)0x0) {
      fVar45 = 0.0;
    }
    else {
      cVar26 = clock();
      while( true ) {
        while ((iVar5 = getc(pFVar23), iVar5 == 10 || (iVar5 == 0xd))) {
          iVar36 = 0;
          yatrie_add(&local_4e58,0,uVar18);
          memset(&local_4e58,0,0x200);
        }
        if (iVar5 == -1) break;
        *(char *)((long)&local_4e58 + (long)iVar36) = (char)iVar5;
        iVar36 = iVar36 + 1;
      }
      cVar27 = clock();
      fclose(pFVar23);
      fVar45 = (float)(cVar27 - cVar26);
    }
    printf("Trie creation time: %fs\n",(double)(fVar45 / 1e+06));
    puts("TRAVERSE ALL NODES STARTING FROM \'af\' NODE\n");
    uVar24 = (ulong)local_5198 >> 0x10;
    local_5198 = CONCAT62((uint6)uVar24 & 0xffffffffff00,0x6661);
    iVar36 = yatrie_get_id(&local_5198,0,uVar18);
    if (iVar36 == 0) {
      printf("word: %s not found in the trie. Test aborted!\n",&local_5198);
    }
    else {
      puVar28 = (uint *)calloc(1,0x2714);
      local_50d8 = 0;
      local_50e8 = 0;
      uStack_50e0 = 0;
      local_50f8 = 0;
      uStack_50f0 = 0;
      local_5108 = 0;
      uStack_5100 = 0;
      local_5118 = 0;
      uStack_5110 = 0;
      local_5128 = 0;
      uStack_5120 = 0;
      local_5138 = 0;
      uStack_5130 = 0;
      encode_string(&local_5138,&local_5198);
      uStack_4ec2 = 0;
      uStack_4ec0 = 0;
      uStack_4ebc = 0;
      local_4eb8 = 0;
      uStack_4e64 = 0;
      uStack_4e74 = 0;
      uStack_4e70 = 0;
      uStack_4e6c = 0;
      local_4e68 = 0;
      uStack_4e84 = 0;
      uStack_4e80 = 0;
      uStack_4e7c = 0;
      local_4e78 = 0;
      uStack_4e94 = 0;
      uStack_4e90 = 0;
      uStack_4e8c = 0;
      local_4e88 = 0;
      uStack_4ea4 = 0;
      uStack_4ea0 = 0;
      uStack_4e9c = 0;
      local_4e98 = 0;
      uStack_4eb4 = 0;
      uStack_4eb0 = 0;
      uStack_4eac = 0;
      local_4ea8 = 0;
      local_4ec8 = 2;
      uStack_4ec6 = 0;
      uStack_4ec5 = 0;
      uStack_4ec4 = (undefined2)local_5138;
      yatrie_node_traverse(puVar28,iVar36,&local_4ec8,uVar18);
      if (*puVar28 != 0) {
        puVar37 = puVar28 + 1;
        uVar24 = 0;
        do {
          memset(&local_50c8,0,0x100);
          decode_string(&local_50c8,puVar37);
          printf("returned: %s\n");
          uVar24 = uVar24 + 1;
          puVar37 = puVar37 + 0x19;
        } while (uVar24 < *puVar28);
      }
      puts("\n");
      yatrie_free(uVar18);
      free(puVar28);
    }
    tests_passed = tests_passed + 1;
    return tests_failed;
  }
  local_51c8 = clock();
  puVar40 = &local_4e58;
  uVar32 = 0;
  while( true ) {
    while ((iVar36 = getc(pFVar23), iVar36 == 0xd || (iVar36 == 10))) {
      uVar33 = uVar32 + 1;
      uVar17 = yatrie_add(&local_4e58,0,puVar22);
      *(undefined4 *)((long)pvVar30 + (ulong)uVar32 * 4 + 4) = uVar17;
      memset(&local_4e58,0,0x200);
      puVar40 = &local_4e58;
      uVar32 = uVar33;
      if ((uVar33 & 0x3ffff) == 0) {
        printf("a:%d\n");
      }
    }
    if (iVar36 == -1) break;
    *(char *)puVar40 = (char)iVar36;
    puVar40 = (undefined4 *)((long)puVar40 + 1);
  }
  cVar26 = clock();
  rewind(pFVar23);
  uVar32 = 0;
  do {
    uVar24 = (ulong)uVar32;
    puVar40 = &local_4e58;
    while ((iVar36 = getc(pFVar23), iVar36 != 0xd && (iVar36 != 10))) {
      if (iVar36 == -1) {
        fclose(pFVar23);
        goto LAB_001049e5;
      }
      *(char *)puVar40 = (char)iVar36;
      puVar40 = (undefined4 *)((long)puVar40 + 1);
    }
    uVar32 = uVar32 + 1;
    uVar17 = yatrie_get_id(&local_4e58,0,puVar22);
    *(undefined4 *)((long)__s2 + uVar24 * 4 + 4) = uVar17;
    memset(&local_4e58,0,0x200);
    if ((uVar32 & 0x3ffff) == 0) {
      printf("g:%d\n");
    }
  } while( true );
}

Assistant:

static int all_tests() {
    U_RUN(test_foo);

    U_RUN(test_yatrie_get_word_nodes);
    U_RUN(test_yatrie_new);
    U_RUN(test_load_missed_file);
    U_RUN(test_bit_int32_count);
    U_RUN(test_bit_get);
    U_RUN(test_bit_set);
    U_RUN(test_bit_array_set);
    U_RUN(test_bit_array_get);
    U_RUN(test_bit_count);
    U_RUN(test_char_bit_count);
    U_RUN(test_char_mask_get_bits_raised);
    U_RUN(test_char_mask_get_bits_raised_pre);
    U_RUN(test_trie_save_load);
    U_RUN(test_node_traverse_decode);
    U_RUN(test_decode_string);
    U_RUN(test_node_insert_ref);
    U_RUN(test_trie_get_id);
    U_RUN(test_node_traverse);
    U_RUN(test_trie_add);
    U_RUN(test_node_get_children);
    U_RUN(test_mask_get_bits_raised_pre);
    U_RUN(test_trie_char_add);
    U_RUN(test_transcode_string);
    U_RUN(complex_test);
    U_RUN(another_node_traverse);

    return tests_failed;
}